

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void traverse_hplane_sim<PredictionData<float,long>,double>
               (WorkerForSimilarity *workspace,PredictionData<float,_long> *prediction_data,
               ExtIsoForest *model_outputs,vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,
               size_t curr_tree,bool as_kernel)

{
  pointer n;
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  double *pdVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  reference this;
  size_type sVar10;
  pointer puVar11;
  ExtIsoForest *in_RCX;
  long lVar12;
  PredictionData<float,_long> *in_RDX;
  WorkerForSimilarity *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_R8;
  byte in_R9B;
  size_t orig_end;
  size_t split_ix;
  size_t col_1;
  size_t col;
  double unused;
  size_t ncols_categ;
  size_t ncols_numeric;
  size_t j_1;
  size_t i_1;
  double *rmat_this;
  size_t n_group;
  size_t j;
  size_t i;
  size_t j_;
  size_t i_;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb58;
  int *in_stack_fffffffffffffb60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb70;
  unsigned_long *in_stack_fffffffffffffb78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  double in_stack_fffffffffffffba8;
  size_t *in_stack_fffffffffffffbb0;
  double *in_stack_fffffffffffffbb8;
  float *in_stack_fffffffffffffbc0;
  double *in_stack_fffffffffffffbc8;
  size_t in_stack_fffffffffffffbd0;
  size_t in_stack_fffffffffffffbd8;
  size_t *in_stack_fffffffffffffbe0;
  double *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  pointer puVar13;
  double *in_stack_fffffffffffffc00;
  size_t *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc40;
  double in_stack_fffffffffffffc48;
  double in_stack_fffffffffffffc50;
  float *in_stack_fffffffffffffc58;
  reference in_stack_fffffffffffffc60;
  unsigned_long *in_stack_fffffffffffffc68;
  pointer in_stack_fffffffffffffc70;
  pointer in_stack_fffffffffffffc78;
  double *in_stack_fffffffffffffc80;
  pointer in_stack_fffffffffffffc90;
  long *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  double *in_stack_fffffffffffffca8;
  reference in_stack_fffffffffffffcb0;
  double *in_stack_fffffffffffffcb8;
  pointer in_stack_fffffffffffffcc0;
  unsigned_long *in_stack_fffffffffffffdb8;
  pointer in_stack_fffffffffffffdc0;
  pointer in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  double *in_stack_fffffffffffffdd8;
  unsigned_long *in_stack_fffffffffffffde0;
  pointer in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  double *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  pointer *this_00;
  size_t *in_stack_fffffffffffffe20;
  size_t *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  double local_1a8;
  size_type local_168;
  ulong local_160;
  value_type local_158;
  undefined4 local_14c;
  double *local_148;
  double *local_140;
  double *local_138;
  size_type local_130;
  size_type local_128;
  unsigned_long *local_120;
  unsigned_long *local_118;
  unsigned_long *local_110;
  unsigned_long *local_108;
  unsigned_long *local_100;
  pointer local_f8;
  pointer local_f0;
  double *local_e8;
  unsigned_long *local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  long local_a0;
  pointer local_98;
  pointer local_90;
  ulong local_88;
  value_type local_80;
  unsigned_long *local_78;
  unsigned_long *local_70;
  unsigned_long *local_68;
  unsigned_long *local_60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffa8;
  undefined1 as_kernel_00;
  undefined7 in_stack_ffffffffffffffb0;
  
  bVar1 = in_R9B & 1;
  if ((!interrupt_switch) &&
     (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffb70._M_current);
    if (bVar2) {
      local_60 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffb58);
      in_stack_ffffffffffffffa8 =
           __gnu_cxx::
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffb68._M_current,
                       (difference_type)in_stack_fffffffffffffb60);
      local_78 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffb58);
      local_70 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffb68._M_current,
                             (difference_type)in_stack_fffffffffffffb60);
      local_68 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffb68._M_current,
                             (difference_type)in_stack_fffffffffffffb60);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffffb70._M_current,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffffb68._M_current);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,(size_type)
                                 in_RDI[1].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      if (in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage <= (pointer)*pvVar6) {
        return;
      }
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,(size_type)
                                 in_RDI[1].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
      if ((pointer)*pvVar6 <
          in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        return;
      }
    }
    pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                       ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_R8);
    if (pvVar3->hplane_left == 0) {
      if ((bVar1 & 1) == 0) {
        bVar2 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffffb70._M_current);
        if (bVar2) {
          bVar2 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffb70._M_current);
          if (!bVar2) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x586a8e);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x586afa);
            if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
              std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_R8);
              expected_separation_depth<double>((double)in_stack_fffffffffffffb78);
            }
            increase_comb_counter_in_groups
                      (in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (double *)in_stack_fffffffffffffb88._M_current,
                       (double)in_stack_fffffffffffffb80._M_current);
          }
        }
        else {
          puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x586940);
          puVar13 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar11 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          n = (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
          pdVar5 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x586995);
          if (((ulong)in_RDI[6].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
            std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_R8);
            local_1a8 = expected_separation_depth<double>((double)in_stack_fffffffffffffb78);
          }
          else {
            local_1a8 = 3.0;
          }
          increase_comb_counter(puVar4,(size_t)puVar13,(size_t)puVar11,(size_t)n,pdVar5,local_1a8);
        }
      }
      else {
        bVar2 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffffb70._M_current);
        if (bVar2) {
          bVar2 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffb70._M_current);
          if (!bVar2) {
            local_b0 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffb58);
            local_a8 = (unsigned_long *)
                       __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffffb68._M_current,
                                   (difference_type)in_stack_fffffffffffffb60);
            local_c8 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffb58);
            local_c0 = (unsigned_long *)
                       __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffffb68._M_current,
                                   (difference_type)in_stack_fffffffffffffb60);
            local_e0 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffb58);
            local_d8 = (unsigned_long *)
                       __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffffb68._M_current,
                                   (difference_type)in_stack_fffffffffffffb60);
            local_d0 = (unsigned_long *)
                       __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffffb68._M_current,
                                   (difference_type)in_stack_fffffffffffffb60);
            local_b8 = (unsigned_long *)
                       std::
                       lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                                 (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                                  in_stack_fffffffffffffb78);
            local_a0 = std::
                       distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                 ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )in_stack_fffffffffffffb70._M_current,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )in_stack_fffffffffffffb68._M_current);
            for (local_f0 = in_RDI[1].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                local_f0 <
                (pointer)((long)in_RDI[1].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + local_a0);
                local_f0 = (pointer)((long)local_f0 + 1)) {
              pdVar5 = std::vector<double,_std::allocator<double>_>::data
                                 ((vector<double,_std::allocator<double>_> *)0x586f46);
              pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in_RDI,(size_type)local_f0);
              local_e8 = pdVar5 + *pvVar6 * (long)in_RDI[5].
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
              ;
              for (local_f8 = (pointer)((long)in_RDI[1].
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start + local_a0);
                  local_f8 <=
                  in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
                  local_f8 = (pointer)((long)local_f8 + 1)) {
                pdVar5 = local_e8;
                pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in_RDI,(size_type)local_f8);
                lVar12 = *pvVar6 - (long)in_RDI[5].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                pdVar5[lVar12] = pdVar5[lVar12] + 1.0;
              }
            }
          }
        }
        else {
          for (local_90 = in_RDI[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
              local_90 <
              in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish; local_90 = (pointer)((long)local_90 + 1)) {
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in_RDI,(size_type)local_90);
            local_80 = *pvVar6;
            local_98 = local_90;
            while (local_98 = (pointer)((long)local_98 + 1),
                  local_98 <=
                  in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
              pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in_RDI,(size_type)local_98);
              local_88 = *pvVar6;
              this_00 = &in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (local_80 < local_88) {
                sVar7 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &in_RDI[3].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                sVar7 = (sVar7 + (local_88 - local_80) + -1) -
                        (((long)(in_RSI->ix_arr).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - local_80) *
                         ((long)(in_RSI->ix_arr).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + (-1 - local_80))
                        >> 1);
              }
              else {
                sVar7 = std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)
                                   &in_RDI[3].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                sVar7 = (sVar7 + (local_80 - local_88) + -1) -
                        (((long)(in_RSI->ix_arr).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - local_88) *
                         ((long)(in_RSI->ix_arr).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + (-1 - local_88))
                        >> 1);
              }
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)this_00,sVar7);
              *pvVar8 = *pvVar8 + 1.0;
            }
          }
        }
      }
    }
    else {
      if ((in_R8 != (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0) && ((bVar1 & 1) == 0)) {
        bVar2 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)
                           in_stack_fffffffffffffb70._M_current);
        if (bVar2) {
          bVar2 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffb70._M_current);
          if (!bVar2) {
            in_stack_fffffffffffffdb8 =
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x587145);
            in_stack_fffffffffffffdc0 =
                 in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
            in_stack_fffffffffffffdc8 =
                 in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            in_stack_fffffffffffffdd0 =
                 in_RDI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
            in_stack_fffffffffffffdd8 =
                 (double *)
                 (in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x5871b1);
            increase_comb_counter_in_groups
                      (in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (double *)in_stack_fffffffffffffb88._M_current,
                       (double)in_stack_fffffffffffffb80._M_current);
          }
        }
        else {
          in_stack_fffffffffffffde0 =
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x587095);
          in_stack_fffffffffffffde8 =
               in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          in_stack_fffffffffffffdf0 =
               in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar13 = (in_RSI->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pdVar5 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x5870ea);
          increase_comb_counter
                    (in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffde8,
                     (size_t)in_stack_fffffffffffffdf0,(size_t)puVar13,pdVar5,-1.0);
        }
      }
      if (((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0) &&
         (sVar7 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[3].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage), sVar7 != 0)) {
        local_108 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffb58);
        local_100 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb68._M_current,
                                (difference_type)in_stack_fffffffffffffb60);
        local_120 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffb58);
        local_118 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb68._M_current,
                                (difference_type)in_stack_fffffffffffffb60);
        local_110 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb68._M_current,
                                (difference_type)in_stack_fffffffffffffb60);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffffb70._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffffb68._M_current);
      }
      local_128 = 0;
      local_130 = 0;
      local_138 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb58);
      local_148 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffb58);
      local_140 = (double *)
                  __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator+(in_stack_fffffffffffffb68._M_current,
                            (difference_type)in_stack_fffffffffffffb60);
      local_14c = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      if (((in_RSI->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) &&
         ((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0)) {
        local_168 = 0;
        while( true ) {
          sVar7 = local_168;
          pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                              (size_type)in_R8);
          sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             (&pvVar3->col_num);
          as_kernel_00 = (undefined1)((ulong)in_stack_ffffffffffffffa8._M_current >> 0x38);
          if (sVar10 <= sVar7) break;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x587dcf);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x587e10);
          pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                              (size_type)in_R8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&pvVar3->col_num,local_168);
          pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                              (size_type)in_R8);
          std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->coef,local_168);
          pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                              (size_type)in_R8);
          std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->mean,local_168);
          if ((int)in_RDX->ncols_numeric == 0) {
            pvVar8 = &local_158;
          }
          else {
            pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                               ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                (size_type)in_R8);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar3->fill_val,local_168);
          }
          add_linear_comb<float>
                    (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                     (double)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     in_stack_fffffffffffffbf0,(MissingAction)in_stack_fffffffffffffbf8,
                     in_stack_fffffffffffffc00,(size_t *)pvVar8,
                     SUB41((uint)in_stack_fffffffffffffba4 >> 0x18,0));
          local_168 = local_168 + 1;
        }
      }
      else {
        local_160 = 0;
        while( true ) {
          pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                              (size_type)in_R8);
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar3->col_num)
          ;
          as_kernel_00 = (undefined1)((ulong)in_stack_ffffffffffffffa8._M_current >> 0x38);
          if (sVar7 <= local_160) break;
          pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                             ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                              (size_type)in_R8);
          pvVar9 = std::vector<ColType,_std::allocator<ColType>_>::operator[]
                             (&pvVar3->col_type,local_160);
          if (*pvVar9 == Numeric) {
            if ((in_RSI->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x587438);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x587479);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&pvVar3->col_num,local_160);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->coef,local_128);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->mean,local_128);
              if ((int)in_RDX->ncols_numeric != 0) {
                pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                   ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                    (size_type)in_R8);
                std::vector<double,_std::allocator<double>_>::operator[]
                          (&pvVar3->fill_val,local_160);
              }
              add_linear_comb<float>
                        (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                         in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                         in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                         (double)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                         in_stack_fffffffffffffbf0,(MissingAction)in_stack_fffffffffffffbf8,
                         in_stack_fffffffffffffc00,in_stack_fffffffffffffc08,
                         SUB41((uint)in_stack_fffffffffffffba4 >> 0x18,0));
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x58763c);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&pvVar3->col_num,local_160);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x5876ad);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->coef,local_128);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->mean,local_128);
              if ((int)in_RDX->ncols_numeric != 0) {
                pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                   ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                    (size_type)in_R8);
                std::vector<double,_std::allocator<double>_>::operator[]
                          (&pvVar3->fill_val,local_160);
              }
              add_linear_comb<float,long>
                        ((size_t *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
                         (size_t)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68,
                         in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                         (long *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc98,
                         (double *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                         in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                         in_stack_fffffffffffffca8,(MissingAction)in_stack_fffffffffffffcb0,
                         in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0,
                         SUB81((ulong)in_stack_fffffffffffffc40 >> 0x38,0));
            }
            local_128 = local_128 + 1;
          }
          else if (*pvVar9 == Categorical) {
            if (*(int *)&in_RDX->field_0x1c == 0) {
              in_stack_fffffffffffffc68 =
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x587ae9);
              in_stack_fffffffffffffc70 =
                   in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              in_stack_fffffffffffffc78 =
                   in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              in_stack_fffffffffffffc80 =
                   std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x587b2a);
              in_stack_fffffffffffffc90 =
                   (in_RSI->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar13 = (in_RSI->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&pvVar3->col_num,local_160);
              in_stack_fffffffffffffc98 =
                   (long *)((long)in_stack_fffffffffffffc90 + (long)puVar13 * *pvVar6 * 4);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              this = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&pvVar3->cat_coef,local_130);
              sVar7 = std::vector<double,_std::allocator<double>_>::size(this);
              in_stack_fffffffffffffca4 = (undefined4)sVar7;
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&pvVar3->cat_coef,local_130);
              in_stack_fffffffffffffca8 =
                   std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x587c0e);
              if ((int)in_RDX->ncols_numeric == 0) {
                in_stack_fffffffffffffc60 = &local_158;
              }
              else {
                pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                   ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                    (size_type)in_R8);
                in_stack_fffffffffffffc60 =
                     std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar3->fill_val,local_160);
              }
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->fill_new,local_130);
              add_linear_comb<double>
                        (in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8,
                         (size_t)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         (int *)in_stack_fffffffffffffdd0,
                         (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),in_stack_fffffffffffffe00,
                         (double)in_stack_fffffffffffffdc0,(int)in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         (NewCategAction)in_stack_fffffffffffffe30,
                         (MissingAction)in_stack_fffffffffffffe38,
                         (CategSplit)in_stack_fffffffffffffe40,
                         SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x38,0));
            }
            else if (*(int *)&in_RDX->field_0x1c == 0x29) {
              in_stack_fffffffffffffcb8 =
                   (double *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x5878a1);
              in_stack_fffffffffffffcc0 =
                   in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x5878e2);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&pvVar3->col_num,local_160);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<double,_std::allocator<double>_>::operator[](&pvVar3->fill_new,local_130);
              pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                 ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                  (size_type)in_R8);
              std::vector<int,_std::allocator<int>_>::operator[](&pvVar3->chosen_cat,local_130);
              if ((int)in_RDX->ncols_numeric == 0) {
                in_stack_fffffffffffffcb0 = &local_158;
              }
              else {
                pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                                   ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,
                                    (size_type)in_R8);
                in_stack_fffffffffffffcb0 =
                     std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar3->fill_val,local_160);
              }
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &in_RDI[2].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
              add_linear_comb<double>
                        (in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8,
                         (size_t)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         (int *)in_stack_fffffffffffffdd0,
                         (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),in_stack_fffffffffffffe00,
                         (double)in_stack_fffffffffffffdc0,(int)in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         (NewCategAction)in_stack_fffffffffffffe30,
                         (MissingAction)in_stack_fffffffffffffe38,
                         (CategSplit)in_stack_fffffffffffffe40,
                         SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x38,0));
            }
            local_130 = local_130 + 1;
          }
          local_160 = local_160 + 1;
        }
      }
      puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x587fe9);
      pdVar5 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x588002);
      puVar13 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar11 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                         ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_R8);
      puVar11 = (pointer)divide_subset_split(puVar4,pdVar5,(size_t)puVar13,(size_t)puVar11,
                                             pvVar3->split_point);
      puVar13 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start < puVar11) {
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)((long)puVar11 - 1);
        std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                  ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_R8);
        traverse_hplane_sim<PredictionData<float,long>,double>
                  (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar1,in_stack_ffffffffffffffb0),
                   (bool)as_kernel_00);
      }
      if (puVar11 <= puVar13) {
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar11;
        in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar13;
        std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[]
                  ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)in_RCX,(size_type)in_R8);
        traverse_hplane_sim<PredictionData<float,long>,double>
                  (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(bVar1,in_stack_ffffffffffffffb0),
                   (bool)as_kernel_00);
      }
    }
  }
  return;
}

Assistant:

void traverse_hplane_sim(WorkerForSimilarity     &workspace,
                         PredictionData          &prediction_data,
                         ExtIsoForest            &model_outputs,
                         std::vector<IsoHPlane>  &hplanes,
                         size_t                  curr_tree,
                         const bool              as_kernel)
{
    if (interrupt_switch)
        return;
    
    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (hplanes[curr_tree].hplane_left == 0)
    {
        if (!as_kernel)
        {
            if (!workspace.tmat_sep.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.assume_full_distr? 3. : 
                                      expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                  + (ldouble_safe)(workspace.end - workspace.st + 1))
                                      );
            else if (!workspace.rmat.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                                prediction_data.nrows, workspace.rmat.data(),
                                                workspace.assume_full_distr? 3. : 
                                                expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                            + (ldouble_safe)(workspace.end - workspace.st + 1))
                                                );
        }

        else
        {
            if (!workspace.tmat_sep.empty())
            {
                size_t i_, j_;
                for (size_t i = workspace.st; i < workspace.end; i++)
                {
                    i_ = workspace.ix_arr[i];
                    for (size_t j = i + 1; j <= workspace.end; j++)
                    {
                        j_ = workspace.ix_arr[j];
                        workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                    }
                }
            }

            else if (!workspace.rmat.empty())
            {
                size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                               std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                workspace.ix_arr.begin() + workspace.end + 1,
                                                                workspace.n_from));
                double *restrict rmat_this;
                for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                {
                    rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                    for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                    {
                        rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
            increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                  prediction_data.nrows, workspace.tmat_sep.data(), -1.);
        else if (!workspace.rmat.empty())
            increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                            prediction_data.nrows, workspace.rmat.data(), -1.);
    }

    if (prediction_data.Xc_indptr != NULL && workspace.tmat_sep.size())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    /* reconstruct linear combination */
    size_t ncols_numeric = 0;
    size_t ncols_categ   = 0;
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0);
    double unused;
    if (prediction_data.categ_data != NULL || prediction_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch(hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    if (prediction_data.Xc_indptr == NULL)
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                        prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    else
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                        hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                        prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    switch(model_outputs.cat_split_type)
                    {
                        case SingleCateg:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int)0, NULL, hplanes[curr_tree].fill_new[ncols_categ],
                                            hplanes[curr_tree].chosen_cat[ncols_categ],
                                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                            workspace.comb_val[0], NULL, NULL, model_outputs.new_cat_action,
                                            model_outputs.missing_action, SingleCateg, false);
                            break;
                        }

                        case SubSet:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int) hplanes[curr_tree].cat_coef[ncols_categ].size(),
                                            hplanes[curr_tree].cat_coef[ncols_categ].data(), (double) 0, (int) 0,
                                            (model_outputs.missing_action == Fail)? unused : hplanes[curr_tree].fill_val[col],
                                            hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                            model_outputs.new_cat_action, model_outputs.missing_action, SubSet, false);
                            break;
                        }
                    }
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            } 
        }
    }

    
    else /* faster version for numerical-only */
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                            prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_left,
                            as_kernel);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_right,
                            as_kernel);
    }

}